

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::OnRead(cmProcess *this,ssize_t nread,uv_buf_t *buf)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  ostream *poVar2;
  char *pcVar3;
  cmCTest *this_00;
  uv_timer_s *handle;
  string local_238 [32];
  undefined1 local_218 [8];
  ostringstream cmCTestLog_msg;
  int error;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  const_iterator local_78;
  undefined1 local_60 [8];
  string strdata;
  string line;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  cmProcess *this_local;
  
  std::__cxx11::string::string((string *)(strdata.field_2._M_local_buf + 8));
  if (nread < 1) {
    if (nread != 0) {
      if (nread != -0xfff) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        poVar2 = std::operator<<((ostream *)local_218,"Error reading stream: ");
        pcVar3 = uv_strerror((int)nread);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_00 = cmCTestRunTest::GetCTest(this->Runner);
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmProcess.cxx"
                     ,0x116,pcVar3,false);
        std::__cxx11::string::~string(local_238);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      }
      bVar1 = Buffer::GetLast(&this->Output,(string *)((long)&strdata.field_2 + 8));
      if (bVar1) {
        cmCTestRunTest::CheckOutput(this->Runner,(string *)((long)&strdata.field_2 + 8));
      }
      this->ReadHandleClosed = true;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
                ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
      if ((this->ProcessHandleClosed & 1U) != 0) {
        handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_((uv_handle_ptr_ *)&this->Timer);
        uv_timer_stop(handle);
        cmCTestRunTest::FinalizeTest(this->Runner);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)local_60);
    cmProcessOutput::DecodeText(&this->Conv,buf->base,nread,(string *)local_60,0);
    local_80._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           (&(this->Output).super_vector<char,_std::allocator<char>_>);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_78,
               &local_80);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)&this->Output,local_78,__first,__last);
    while (bVar1 = Buffer::GetLine(&this->Output,(string *)((long)&strdata.field_2 + 8)), bVar1) {
      cmCTestRunTest::CheckOutput(this->Runner,(string *)((long)&strdata.field_2 + 8));
      std::__cxx11::string::clear();
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::~string((string *)(strdata.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmProcess::OnRead(ssize_t nread, const uv_buf_t* buf)
{
  std::string line;
  if (nread > 0) {
    std::string strdata;
    this->Conv.DecodeText(buf->base, static_cast<size_t>(nread), strdata);
    this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());

    while (this->Output.GetLine(line)) {
      this->Runner.CheckOutput(line);
      line.clear();
    }

    return;
  }

  if (nread == 0) {
    return;
  }

  // The process will provide no more data.
  if (nread != UV_EOF) {
    auto error = static_cast<int>(nread);
    cmCTestLog(this->Runner.GetCTest(), ERROR_MESSAGE,
               "Error reading stream: " << uv_strerror(error) << std::endl);
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    this->Runner.CheckOutput(line);
  }

  this->ReadHandleClosed = true;
  this->PipeReader.reset();
  if (this->ProcessHandleClosed) {
    uv_timer_stop(this->Timer);
    this->Runner.FinalizeTest();
  }
}